

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcFragDepthTests.cpp
# Opt level: O2

void __thiscall deqp::FragDepthCompareCase::~FragDepthCompareCase(FragDepthCompareCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FragDepthCompareCase_01dfd220;
  std::__cxx11::string::~string((string *)&this->m_fragSrc);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

FragDepthCompareCase::~FragDepthCompareCase(void)
{
}